

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXAlgorithms.h
# Opt level: O0

string * ZXing::ToString<long_long,void>(longlong val,int len)

{
  undefined8 uVar1;
  int in_EDX;
  string *in_RSI;
  string *in_RDI;
  string *result;
  string *in_stack_ffffffffffffff38;
  Type in_stack_ffffffffffffff45;
  short in_stack_ffffffffffffff46;
  char *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar2;
  allocator<char> *in_stack_ffffffffffffff60;
  allocator<char> *__a;
  string *this;
  allocator<char> local_49 [51];
  allocator<char> local_16;
  undefined1 local_15;
  int local_14;
  string *local_10;
  
  local_15 = 0;
  local_14 = in_EDX + -1;
  this = in_RDI;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (size_type)in_stack_ffffffffffffff48,(char)((ushort)in_stack_ffffffffffffff46 >> 8),
             (allocator<char> *)in_stack_ffffffffffffff38);
  std::allocator<char>::~allocator(&local_16);
  if ((long)local_10 < 0) {
    uVar1 = __cxa_allocate_exception(0x30);
    __a = local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    Error::Error((Error *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff46,in_stack_ffffffffffffff45,
                 in_stack_ffffffffffffff38);
    __cxa_throw(uVar1,&Error::typeinfo,Error::~Error);
  }
  for (; uVar2 = -1 < local_14 && local_10 != (string *)0x0,
      -1 < local_14 && local_10 != (string *)0x0; local_14 = local_14 + -1) {
    in_stack_ffffffffffffff46 =
         CONCAT11((char)local_10 +
                  ((char)(SUB164(SEXT816((long)local_10) * SEXT816(0x6666666666666667),8) >> 2) -
                  (SUB161(SEXT816((long)local_10) * SEXT816(0x6666666666666667),0xf) >> 7)) * -10 +
                  '0',(char)in_stack_ffffffffffffff46);
    in_stack_ffffffffffffff38 = local_10;
    in_stack_ffffffffffffff48 = (char *)std::__cxx11::string::operator[]((ulong)this);
    *in_stack_ffffffffffffff48 = (char)((ushort)in_stack_ffffffffffffff46 >> 8);
    local_10 = (string *)((long)local_10 / 10);
  }
  if (local_10 == (string *)0x0) {
    return in_RDI;
  }
  uVar1 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,in_stack_ffffffffffffff60);
  Error::Error((Error *)CONCAT17(uVar2,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff46,in_stack_ffffffffffffff45,in_stack_ffffffffffffff38);
  __cxa_throw(uVar1,&Error::typeinfo,Error::~Error);
}

Assistant:

std::string ToString(T val, int len)
{
	std::string result(len--, '0');
	if (val < 0)
		throw FormatError("Invalid value");
	for (; len >= 0 && val != 0; --len, val /= 10)
		result[len] = '0' + val % 10;
	if (val)
		throw FormatError("Invalid value");
	return result;
}